

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

MockSpec<test_result_(fmt::v5::monostate)> * __thiscall
testing::internal::FunctionMocker<test_result_(fmt::v5::monostate)>::With
          (FunctionMocker<test_result_(fmt::v5::monostate)> *this,Matcher<fmt::v5::monostate> *m1)

{
  linked_ptr_internal lVar1;
  linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_> local_28;
  
  local_28.value_ = (m1->super_MatcherBase<fmt::v5::monostate>).impl_.value_;
  lVar1.next_ = &local_28.link_;
  if (local_28.value_ != (MatcherInterface<fmt::v5::monostate> *)0x0) {
    linked_ptr_internal::join
              (&local_28.link_,&(m1->super_MatcherBase<fmt::v5::monostate>).impl_.link_);
    lVar1.next_ = local_28.link_.next_;
  }
  local_28.link_.next_ = lVar1.next_;
  linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_>::operator=
            (&(this->super_FunctionMockerBase<test_result_(fmt::v5::monostate)>).current_spec_.
              matchers_.f0_.super_MatcherBase<fmt::v5::monostate>.impl_,&local_28);
  linked_ptr<const_testing::MatcherInterface<fmt::v5::monostate>_>::~linked_ptr(&local_28);
  return &(this->super_FunctionMockerBase<test_result_(fmt::v5::monostate)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }